

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

RecyclableObject *
Js::JavascriptOperators::OP_GetPrototype(Var instance,ScriptContext *scriptContext)

{
  bool bVar1;
  DynamicObject *instance_00;
  RecyclableObject *pRVar2;
  
  bVar1 = VarIs<Js::RecyclableObject>(instance);
  if (bVar1) {
    instance_00 = (DynamicObject *)VarTo<Js::RecyclableObject>(instance);
    if (((instance_00->super_RecyclableObject).type.ptr)->typeId != TypeIds_Null) {
      pRVar2 = GetPrototype((RecyclableObject *)instance_00);
      return pRVar2;
    }
  }
  else {
    instance_00 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                  super_JavascriptLibraryBase).numberPrototype.ptr;
  }
  return &instance_00->super_RecyclableObject;
}

Assistant:

RecyclableObject* JavascriptOperators::OP_GetPrototype(Var instance, ScriptContext* scriptContext)
    {
        if (TaggedNumber::Is(instance))
        {
            return scriptContext->GetLibrary()->GetNumberPrototype();
        }
        else
        {
            RecyclableObject* object = VarTo<RecyclableObject>(instance);
            if (JavascriptOperators::IsNull(object))
            {
                return object;
            }

            return JavascriptOperators::GetPrototype(object);
        }
    }